

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execAndRgEa<(moira::Instr)59,(moira::Mode)6,(moira::Size)1>(Moira *this,u16 opcode)

{
  byte bVar1;
  u32 addr;
  u32 uVar2;
  uint val;
  
  addr = computeEA<(moira::Mode)6,(moira::Size)1,0ul>(this,opcode & 7);
  uVar2 = readM<(moira::MemSpace)1,(moira::Size)1,128ul>(this,addr);
  val = *(byte *)((long)this->exec + (ulong)(opcode >> 9 & 7) * 4 + -0x58) ^ uVar2;
  bVar1 = (byte)val;
  (this->reg).sr.n = (bool)(bVar1 >> 7);
  (this->reg).sr.z = bVar1 == 0;
  (this->reg).sr.v = false;
  (this->reg).sr.c = false;
  uVar2 = (this->reg).pc;
  (this->reg).pc0 = uVar2;
  (this->queue).ird = (this->queue).irc;
  uVar2 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar2 + 2);
  (this->queue).irc = (u16)uVar2;
  writeM<(moira::MemSpace)1,(moira::Size)1,5ul>(this,addr,val);
  return;
}

Assistant:

void
Moira::execAndRgEa(u16 opcode)
{
    int src = ____xxx_________(opcode);
    int dst = _____________xxx(opcode);

    u32 ea, data;
    if (!readOp<M,S, STD_AE_FRAME>(dst, ea, data)) return;

    u32 result = logic<I,S>(readD<S>(src), data);
    isMemMode(M) ? prefetch() : prefetch<POLLIPL>();

    if (S == Long && isRegMode(M)) sync(4);
    writeOp <M,S, POLLIPL | REVERSE> (dst, ea, result);
}